

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.hpp
# Opt level: O0

void duckdb::ParquetDecodeUtils::BitUnpackAligned<unsigned_long>
               (ByteBuffer *src,unsigned_long *dst,idx_t count,bitpacking_width_t width)

{
  undefined8 uVar1;
  byte in_CL;
  ulong in_RDX;
  idx_t read_size;
  bitpacking_width_t in_stack_000000af;
  idx_t in_stack_000000b0;
  unsigned_long *in_stack_000000b8;
  ByteBuffer *in_stack_000000c0;
  uint64_t in_stack_ffffffffffffff98;
  allocator *paVar2;
  allocator local_41;
  unsigned_long in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  uint8_t in_stack_ffffffffffffffd7;
  
  CheckWidth(in_stack_ffffffffffffffd7);
  if ((in_RDX & 0x1f) != 0) {
    uVar1 = __cxa_allocate_exception(0x10);
    paVar2 = &local_41;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffc0,
               "Aligned bitpacking count must be a multiple of %llu",paVar2);
    InvalidInputException::InvalidInputException<unsigned_long>
              ((InvalidInputException *)
               CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    __cxa_throw(uVar1,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException
               );
  }
  ByteBuffer::available((ByteBuffer *)((in_RDX * in_CL) / 8),in_stack_ffffffffffffff98);
  BitUnpackAlignedInternal<unsigned_long>
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000af);
  return;
}

Assistant:

static void BitUnpackAligned(ByteBuffer &src, T *dst, const idx_t count, const bitpacking_width_t width) {
		CheckWidth(width);
		if (count % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE != 0) {
			throw InvalidInputException("Aligned bitpacking count must be a multiple of %llu",
			                            BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE);
		}
		const auto read_size = count * width / BITPACK_DLEN;
		src.available(read_size); // check if buffer has enough space available once
		BitUnpackAlignedInternal(src, dst, count, width);
	}